

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  Expr *root_expr;
  char *pcVar3;
  Var *pVVar4;
  ulong uVar5;
  char *pcVar6;
  pointer pEVar7;
  long lVar8;
  char *pcVar9;
  Var *var;
  ExprVisitor visitor;
  ExprVisitorDelegate delegate;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_c8;
  Index local_b0;
  ExprVisitor local_a8;
  Delegate local_40;
  WatWriter *local_38;
  
  pEVar7 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar7 == pEVar2) {
      return;
    }
    root_expr = pEVar7->expr;
    lVar8 = (long)(pEVar7->children).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar7->children).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start =
         std::
         _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                        *)((lVar8 >> 3) * -0x3333333333333333),(size_t)expr_trees);
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(lVar8 + (long)local_c8.
                                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    local_c8.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         std::__uninitialized_copy<false>::
         __uninit_copy<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,wabt::(anonymous_namespace)::ExprTree*>
                   ((pEVar7->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (pEVar7->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    local_c8.
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    local_b0 = pEVar7->result_count;
    EVar1 = root_expr->type_;
    WritePuts(this,"(",None);
    if ((int)EVar1 < 0x1b) {
      if (EVar1 == Block) {
        if (root_expr->type_ == Block) {
          Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Block_Opcode);
          WriteBeginBlock(this,Block,(Block *)(root_expr + 1),(char *)local_a8.delegate_);
          if (root_expr->type_ == Block) goto LAB_0019560d;
        }
        pcVar6 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
        ;
        goto LAB_001956f1;
      }
      if (EVar1 == If) {
        Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::If_Opcode);
        WriteBeginBlock(this,If,(Block *)(root_expr + 1),(char *)local_a8.delegate_);
        FlushExprTreeVector(this,&local_c8);
        WritePuts(this,"(",None);
        WritePuts(this,"then",Newline);
        this->indent_ = this->indent_ + 2;
        WriteFoldedExprList(this,(ExprList *)&root_expr[3].loc.filename._M_str);
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
        if (root_expr[4].loc.field_1.field_1.offset != 0) {
          WritePuts(this,"(",None);
          WritePuts(this,"else",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,(ExprList *)&root_expr[4].loc);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
        }
        goto LAB_00195627;
      }
LAB_00195441:
      local_40._vptr_Delegate = (_func_int **)&PTR__Delegate_00241b60;
      local_38 = this;
      ExprVisitor::ExprVisitor(&local_a8,&local_40);
      ExprVisitor::VisitExpr(&local_a8,root_expr);
      if (local_a8.catch_index_stack_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.catch_index_stack_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.expr_iter_stack_.
          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.expr_iter_stack_.
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.expr_stack_.
                        super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.state_stack_.
                        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this->indent_ = this->indent_ + 2;
      FlushExprTreeVector(this,&local_c8);
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x2;
      WriteClose(this,Newline);
    }
    else {
      if (EVar1 == Loop) {
        if (root_expr->type_ == Loop) {
          Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Loop_Opcode);
          WriteBeginBlock(this,Loop,(Block *)(root_expr + 1),(char *)local_a8.delegate_);
          if (root_expr->type_ == Loop) goto LAB_0019560d;
        }
        pcVar6 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
        ;
LAB_001956f1:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                      ,0x48,pcVar6);
      }
      if (EVar1 == Try) {
        Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Try_Opcode);
        WriteBeginBlock(this,Try,(Block *)(root_expr + 1),(char *)local_a8.delegate_);
        WritePuts(this,"(",None);
        WritePuts(this,"do",Newline);
        this->indent_ = this->indent_ + 2;
        FlushExprTreeVector(this,&local_c8);
        WriteFoldedExprList(this,(ExprList *)&root_expr[3].loc.filename._M_str);
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
        if (*(int *)&root_expr->field_0x3c == 2) {
          WritePuts(this,"(",None);
          Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Delegate_Opcode);
          WritePuts(this,(char *)local_a8.delegate_,Space);
          WriteVar(this,(Var *)((long)&root_expr[4].loc.field_1 + 8),None);
          WritePuts(this,")",Newline);
        }
        else if (*(int *)&root_expr->field_0x3c == 1) {
          pcVar6 = (char *)root_expr[4].loc.filename._M_len;
          pcVar3 = root_expr[4].loc.filename._M_str;
          if (pcVar6 != pcVar3) {
            pcVar6 = pcVar6 + 0x60;
            do {
              WritePuts(this,"(",None);
              if ((*(int *)(pcVar6 + -0x20) == 0) && (*(int *)(pcVar6 + -0x18) == -1)) {
                WritePuts(this,"catch_all",Newline);
              }
              else {
                Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::Catch_Opcode);
                WritePuts(this,(char *)local_a8.delegate_,Space);
                WriteVar(this,(Var *)(pcVar6 + -0x40),Newline);
              }
              this->indent_ = this->indent_ + 2;
              WriteFoldedExprList(this,(ExprList *)(pcVar6 + 8));
              FlushExprTreeStack(this);
              WriteClose(this,Newline);
              pcVar9 = pcVar6 + 0x20;
              pcVar6 = pcVar6 + 0x80;
            } while (pcVar9 != pcVar3);
          }
        }
      }
      else {
        if (EVar1 != TryTable) goto LAB_00195441;
        Opcode::GetInfo((Info *)&local_a8,(Opcode *)&Opcode::TryTable_Opcode);
        WritePuts(this,(char *)local_a8.delegate_,Space);
        if (root_expr[1].super_intrusive_list_base<wabt::Expr>.next_ == (Expr *)0x0) {
          WriteTypes(this,(TypeVector *)((long)&root_expr[2].loc.field_1 + 8),"param");
          WriteTypes(this,(TypeVector *)&root_expr[3].super_intrusive_list_base<wabt::Expr>,"result"
                    );
          Writef(this," ;; label = @%u",
                 (ulong)(uint)((int)((ulong)((long)(this->super_ModuleContext).label_stack_.
                                                                                                      
                                                  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->super_ModuleContext).label_stack_.
                                                  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              -0x45d1745d));
        }
        else {
          WritePuts(this,(char *)root_expr[1]._vptr_Expr,Space);
          WriteTypes(this,(TypeVector *)((long)&root_expr[2].loc.field_1 + 8),"param");
          WriteTypes(this,(TypeVector *)&root_expr[3].super_intrusive_list_base<wabt::Expr>,"result"
                    );
        }
        if (this->next_char_ == ForceNewline) {
          WriteNextChar(this);
        }
        this->next_char_ = ForceNewline;
        this->indent_ = this->indent_ + 2;
        pcVar6 = (char *)root_expr[4].loc.filename._M_len;
        pcVar3 = root_expr[4].loc.filename._M_str;
        if (pcVar6 != pcVar3) {
          var = (Var *)(pcVar6 + 0x68);
          do {
            WritePuts(this,"(",None);
            uVar5 = (ulong)(uint)var[1].loc.filename._M_len;
            if ((uVar5 < 4) &&
               (WritePuts(this,*(char **)(&DAT_00241dd0 + uVar5 * 8),Space),
               (uint)var[1].loc.filename._M_len < 2)) {
              WriteVar(this,var + -1,Space);
            }
            WriteBrVar(this,var,None);
            WritePuts(this,")",Newline);
            pVVar4 = var + 1;
            var = (Var *)&var[2].field_2;
          } while (&(pVVar4->loc).filename._M_str != (char **)pcVar3);
        }
        ModuleContext::BeginBlock(&this->super_ModuleContext,TryTable,(Block *)(root_expr + 1));
LAB_0019560d:
        WriteFoldedExprList(this,(ExprList *)&root_expr[3].loc.filename._M_str);
        FlushExprTreeStack(this);
      }
LAB_00195627:
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x2;
      WriteClose(this,Newline);
      ModuleContext::EndBlock(&this->super_ModuleContext);
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&local_c8);
    pEVar7 = pEVar7 + 1;
  } while( true );
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}